

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu.cxx
# Opt level: O0

int __thiscall Fl_Menu_Item::size(Fl_Menu_Item *this)

{
  int local_1c;
  Fl_Menu_Item *pFStack_18;
  int nest;
  Fl_Menu_Item *m;
  Fl_Menu_Item *this_local;
  
  local_1c = 0;
  pFStack_18 = this;
  do {
    if (pFStack_18->text == (char *)0x0) {
      if (local_1c == 0) {
        return (int)(((long)pFStack_18 - (long)this) / 0x38) + 1;
      }
      local_1c = local_1c + -1;
    }
    else if ((pFStack_18->flags & 0x40U) != 0) {
      local_1c = local_1c + 1;
    }
    pFStack_18 = pFStack_18 + 1;
  } while( true );
}

Assistant:

int Fl_Menu_Item::size() const {
  const Fl_Menu_Item* m = this;
  int nest = 0;
  for (;;) {
    if (!m->text) {
      if (!nest) return (int) (m-this+1);
      nest--;
    } else if (m->flags & FL_SUBMENU) {
      nest++;
    }
    m++;
  }
}